

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

opj_bool j2k_update_image_data(opj_tcd_v2_t *p_tcd,OPJ_BYTE *p_data,opj_image_t *p_output_image)

{
  byte bVar1;
  OPJ_UINT32 OVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  opj_image_t *poVar6;
  opj_tcd_resolution_v2_t *poVar7;
  OPJ_INT32 *pOVar8;
  long lVar9;
  OPJ_UINT32 OVar10;
  int iVar11;
  uint uVar12;
  OPJ_UINT32 OVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  OPJ_UINT32 OVar19;
  opj_image_comp_t *poVar20;
  int iVar21;
  OPJ_UINT32 OVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  uint uVar26;
  int iVar27;
  opj_tcd_tilecomp_v2_t *poVar28;
  uint uVar29;
  uint uVar30;
  opj_image_comp_t *poVar31;
  OPJ_BYTE *pOVar32;
  int local_64;
  
  poVar6 = p_tcd->image;
  poVar28 = p_tcd->tcd_image->tiles->comps;
  poVar31 = poVar6->comps;
  poVar20 = p_output_image->comps;
  uVar12 = 0;
  while( true ) {
    if (poVar6->numcomps <= uVar12) {
      return 1;
    }
    pOVar8 = poVar20->data;
    OVar22 = poVar20->w;
    OVar2 = poVar20->h;
    if (pOVar8 == (OPJ_INT32 *)0x0) {
      pOVar8 = (OPJ_INT32 *)calloc((ulong)(OVar2 * OVar22),4);
      poVar20->data = pOVar8;
      if (pOVar8 == (OPJ_INT32 *)0x0) {
        return 0;
      }
    }
    uVar3 = poVar31->resno_decoded;
    poVar20->resno_decoded = uVar3;
    poVar7 = poVar28->resolutions;
    iVar21 = ((poVar31->prec >> 3) + 1) - (uint)((poVar31->prec & 7) == 0);
    if (iVar21 == 3) {
      iVar21 = 4;
    }
    bVar1 = (byte)poVar20->factor;
    uVar4 = poVar7[uVar3].x1;
    uVar29 = ~(-1 << (bVar1 & 0x1f));
    uVar26 = (int)(poVar20->x0 + uVar29) >> (bVar1 & 0x1f);
    uVar5 = poVar7[uVar3].x0;
    uVar30 = (int)(uVar29 + poVar20->y0) >> (bVar1 & 0x1f);
    OVar13 = uVar4 - uVar5;
    uVar29 = uVar26 + OVar22;
    iVar23 = uVar26 - uVar5;
    if (uVar26 < uVar5) {
      local_64 = uVar5 - uVar26;
      iVar23 = 0;
      if (uVar29 < uVar4) {
        iVar17 = OVar13 - (uVar29 - uVar5);
        OVar19 = uVar29 - uVar5;
      }
      else {
        iVar17 = 0;
        OVar19 = OVar13;
      }
    }
    else {
      iVar17 = uVar4 - uVar29;
      if (uVar4 < uVar29 || iVar17 == 0) {
        OVar19 = OVar13 - iVar23;
        iVar17 = 0;
        local_64 = 0;
      }
      else {
        local_64 = 0;
        OVar19 = OVar22;
      }
    }
    uVar4 = poVar7[uVar3].y0;
    uVar5 = poVar7[uVar3].y1;
    OVar10 = uVar5 - uVar4;
    uVar3 = OVar2 + uVar30;
    iVar15 = uVar30 - uVar4;
    if (uVar30 < uVar4) {
      iVar27 = uVar4 - uVar30;
      iVar15 = 0;
      if (uVar3 < uVar5) {
        iVar11 = OVar10 - (uVar3 - uVar4);
        OVar10 = uVar3 - uVar4;
      }
      else {
        iVar11 = 0;
      }
    }
    else {
      iVar11 = uVar5 - uVar3;
      if (uVar5 < uVar3 || iVar11 == 0) {
        iVar11 = 0;
        iVar27 = 0;
        OVar10 = OVar10 - iVar15;
      }
      else {
        iVar27 = 0;
        OVar10 = OVar2;
      }
    }
    if (iVar23 < 0) {
      return 0;
    }
    if (iVar15 < 0) {
      return 0;
    }
    if (iVar17 < 0) break;
    if (iVar11 < 0) {
      return 0;
    }
    pOVar8 = pOVar8 + (int)(iVar27 * OVar22 + local_64);
    lVar24 = (long)(int)(iVar15 * OVar13 + iVar23);
    lVar14 = (long)(int)(OVar22 - OVar19);
    uVar18 = (ulong)(uint)(iVar17 + iVar23);
    lVar9 = (long)(int)(iVar11 * OVar13 - iVar23);
    if (iVar21 == 4) {
      pOVar32 = p_data + lVar24 * 4;
      for (OVar22 = 0; OVar22 != OVar10; OVar22 = OVar22 + 1) {
        lVar24 = 0;
        for (lVar25 = 0; OVar19 != (OPJ_UINT32)lVar25; lVar25 = lVar25 + 1) {
          pOVar8[lVar25] = *(OPJ_INT32 *)(pOVar32 + lVar25 * 4);
          lVar24 = lVar24 + -4;
        }
        pOVar8 = (OPJ_INT32 *)((long)pOVar8 + (lVar14 * 4 - lVar24));
        pOVar32 = pOVar32 + (uVar18 * 4 - lVar24);
      }
      p_data = pOVar32 + lVar9 * 4;
    }
    else if (iVar21 == 2) {
      pOVar32 = p_data + lVar24 * 2;
      if (poVar31->sgnd == 0) {
        for (OVar22 = 0; OVar22 != OVar10; OVar22 = OVar22 + 1) {
          lVar24 = uVar18 * -2;
          lVar25 = lVar14 * -4;
          for (lVar16 = 0; OVar19 != (OPJ_UINT32)lVar16; lVar16 = lVar16 + 1) {
            pOVar8[lVar16] = (uint)*(ushort *)(pOVar32 + lVar16 * 2);
            lVar25 = lVar25 + -4;
            lVar24 = lVar24 + -2;
          }
          pOVar8 = (OPJ_INT32 *)((long)pOVar8 - lVar25);
          pOVar32 = pOVar32 + -lVar24;
        }
      }
      else {
        for (OVar22 = 0; OVar22 != OVar10; OVar22 = OVar22 + 1) {
          lVar24 = uVar18 * -2;
          lVar25 = lVar14 * -4;
          for (lVar16 = 0; OVar19 != (OPJ_UINT32)lVar16; lVar16 = lVar16 + 1) {
            pOVar8[lVar16] = (int)*(short *)(pOVar32 + lVar16 * 2);
            lVar25 = lVar25 + -4;
            lVar24 = lVar24 + -2;
          }
          pOVar8 = (OPJ_INT32 *)((long)pOVar8 - lVar25);
          pOVar32 = pOVar32 + -lVar24;
        }
      }
      p_data = pOVar32 + lVar9 * 2;
    }
    else if (iVar21 == 1) {
      pOVar32 = p_data + lVar24;
      if (poVar31->sgnd == 0) {
        for (OVar22 = 0; OVar22 != OVar10; OVar22 = OVar22 + 1) {
          lVar24 = lVar14 * -4;
          for (lVar25 = 0; OVar19 != (OPJ_UINT32)lVar25; lVar25 = lVar25 + 1) {
            pOVar8[lVar25] = (uint)pOVar32[lVar25];
            lVar24 = lVar24 + -4;
          }
          pOVar8 = (OPJ_INT32 *)((long)pOVar8 - lVar24);
          pOVar32 = pOVar32 + lVar25 + uVar18;
        }
      }
      else {
        for (OVar22 = 0; OVar22 != OVar10; OVar22 = OVar22 + 1) {
          lVar24 = lVar14 * -4;
          for (lVar25 = 0; OVar19 != (OPJ_UINT32)lVar25; lVar25 = lVar25 + 1) {
            pOVar8[lVar25] = (int)(char)pOVar32[lVar25];
            lVar24 = lVar24 + -4;
          }
          pOVar8 = (OPJ_INT32 *)((long)pOVar8 - lVar24);
          pOVar32 = pOVar32 + lVar25 + uVar18;
        }
      }
      p_data = pOVar32 + lVar9;
    }
    poVar20 = poVar20 + 1;
    poVar31 = poVar31 + 1;
    poVar28 = poVar28 + 1;
    uVar12 = uVar12 + 1;
  }
  return 0;
}

Assistant:

opj_bool j2k_update_image_data (opj_tcd_v2_t * p_tcd, OPJ_BYTE * p_data, opj_image_t* p_output_image)
{
	OPJ_UINT32 i,j,k = 0;
	OPJ_UINT32 l_width_src,l_height_src;
	OPJ_UINT32 l_width_dest,l_height_dest;
	OPJ_INT32 l_offset_x0_src, l_offset_y0_src, l_offset_x1_src, l_offset_y1_src;
	OPJ_INT32 l_start_offset_src, l_line_offset_src, l_end_offset_src ;
	OPJ_UINT32 l_start_x_dest , l_start_y_dest;
	OPJ_UINT32 l_x0_dest, l_y0_dest, l_x1_dest, l_y1_dest;
	OPJ_INT32 l_start_offset_dest, l_line_offset_dest;

	opj_image_comp_t * l_img_comp_src = 00;
	opj_image_comp_t * l_img_comp_dest = 00;

	opj_tcd_tilecomp_v2_t * l_tilec = 00;
	opj_image_t * l_image_src = 00;
	OPJ_UINT32 l_size_comp, l_remaining;
	OPJ_INT32 * l_dest_ptr;
	opj_tcd_resolution_v2_t* l_res= 00;

	l_tilec = p_tcd->tcd_image->tiles->comps;
	l_image_src = p_tcd->image;
	l_img_comp_src = l_image_src->comps;

	l_img_comp_dest = p_output_image->comps;

	for (i=0; i<l_image_src->numcomps; i++) {

		/* Allocate output component buffer if necessary */
		if (!l_img_comp_dest->data) {

			l_img_comp_dest->data = (OPJ_INT32*) opj_calloc(l_img_comp_dest->w * l_img_comp_dest->h, sizeof(OPJ_INT32));
			if (! l_img_comp_dest->data) {
				return OPJ_FALSE;
			}
		}

		/* Copy info from decoded comp image to output image */
		l_img_comp_dest->resno_decoded = l_img_comp_src->resno_decoded;

		/*-----*/
		/* Compute the precision of the output buffer */
		l_size_comp = l_img_comp_src->prec >> 3; /*(/ 8)*/
		l_remaining = l_img_comp_src->prec & 7;  /* (%8) */
		l_res = l_tilec->resolutions + l_img_comp_src->resno_decoded;

		if (l_remaining) {
			++l_size_comp;
		}

		if (l_size_comp == 3) {
			l_size_comp = 4;
		}
		/*-----*/

		/* Current tile component size*/
		/*if (i == 0) {
		fprintf(stdout, "SRC: l_res_x0=%d, l_res_x1=%d, l_res_y0=%d, l_res_y1=%d\n",
				l_res->x0, l_res->x1, l_res->y0, l_res->y1);
		}*/

		l_width_src = (l_res->x1 - l_res->x0);
		l_height_src = (l_res->y1 - l_res->y0);

		/* Border of the current output component*/
		l_x0_dest = int_ceildivpow2(l_img_comp_dest->x0, l_img_comp_dest->factor);
		l_y0_dest = int_ceildivpow2(l_img_comp_dest->y0, l_img_comp_dest->factor);
		l_x1_dest = l_x0_dest + l_img_comp_dest->w;
		l_y1_dest = l_y0_dest + l_img_comp_dest->h;

		/*if (i == 0) {
		fprintf(stdout, "DEST: l_x0_dest=%d, l_x1_dest=%d, l_y0_dest=%d, l_y1_dest=%d (%d)\n",
				l_x0_dest, l_x1_dest, l_y0_dest, l_y1_dest, l_img_comp_dest->factor );
		}*/

		/*-----*/
		/* Compute the area (l_offset_x0_src, l_offset_y0_src, l_offset_x1_src, l_offset_y1_src)
		 * of the input buffer (decoded tile component) which will be move
		 * in the output buffer. Compute the area of the output buffer (l_start_x_dest,
		 * l_start_y_dest, l_width_dest, l_height_dest)  which will be modified
		 * by this input area.
		 * */
		if ( l_x0_dest < l_res->x0 ) {
			l_start_x_dest = l_res->x0 - l_x0_dest;
			l_offset_x0_src = 0;

			if ( l_x1_dest >= l_res->x1 ) {
				l_width_dest = l_width_src;
				l_offset_x1_src = 0;
			}
			else {
				l_width_dest = l_x1_dest - l_res->x0 ;
				l_offset_x1_src = l_width_src - l_width_dest;
			}
		}
		else {
			l_start_x_dest = 0 ;
			l_offset_x0_src = l_x0_dest - l_res->x0;

			if ( l_x1_dest >= l_res->x1 ) {
				l_width_dest = l_width_src - l_offset_x0_src;
				l_offset_x1_src = 0;
			}
			else {
				l_width_dest = l_img_comp_dest->w ;
				l_offset_x1_src = l_res->x1 - l_x1_dest;
			}
		}

		if ( l_y0_dest < l_res->y0 ) {
			l_start_y_dest = l_res->y0 - l_y0_dest;
			l_offset_y0_src = 0;

			if ( l_y1_dest >= l_res->y1 ) {
				l_height_dest = l_height_src;
				l_offset_y1_src = 0;
			}
			else {
				l_height_dest = l_y1_dest - l_res->y0 ;
				l_offset_y1_src =  l_height_src - l_height_dest;
			}
		}
		else {
			l_start_y_dest = 0 ;
			l_offset_y0_src = l_y0_dest - l_res->y0;

			if ( l_y1_dest >= l_res->y1 ) {
				l_height_dest = l_height_src - l_offset_y0_src;
				l_offset_y1_src = 0;
			}
			else {
				l_height_dest = l_img_comp_dest->h ;
				l_offset_y1_src = l_res->y1 - l_y1_dest;
			}
		}

		if( (l_offset_x0_src < 0 ) || (l_offset_y0_src < 0 ) || (l_offset_x1_src < 0 ) || (l_offset_y1_src < 0 ) ){
			return OPJ_FALSE;
		}
		/*-----*/

		/* Compute the input buffer offset */
		l_start_offset_src = l_offset_x0_src + l_offset_y0_src * l_width_src;
		l_line_offset_src = l_offset_x1_src + l_offset_x0_src;
		l_end_offset_src = l_offset_y1_src * l_width_src - l_offset_x0_src;

		/* Compute the output buffer offset */
		l_start_offset_dest = l_start_x_dest + l_start_y_dest * l_img_comp_dest->w;
		l_line_offset_dest = l_img_comp_dest->w - l_width_dest;

		/* Move the output buffer to the first place where we will write*/
		l_dest_ptr = l_img_comp_dest->data + l_start_offset_dest;

		/*if (i == 0) {
			fprintf(stdout, "COMPO[%d]:\n",i);
			fprintf(stdout, "SRC: l_start_x_src=%d, l_start_y_src=%d, l_width_src=%d, l_height_src=%d\n"
					"\t tile offset:%d, %d, %d, %d\n"
					"\t buffer offset: %d; %d, %d\n",
					l_res->x0, l_res->y0, l_width_src, l_height_src,
					l_offset_x0_src, l_offset_y0_src, l_offset_x1_src, l_offset_y1_src,
					l_start_offset_src, l_line_offset_src, l_end_offset_src);

			fprintf(stdout, "DEST: l_start_x_dest=%d, l_start_y_dest=%d, l_width_dest=%d, l_height_dest=%d\n"
					"\t start offset: %d, line offset= %d\n",
					l_start_x_dest, l_start_y_dest, l_width_dest, l_height_dest, l_start_offset_dest, l_line_offset_dest);
		}*/


		switch (l_size_comp) {
			case 1:
				{
					OPJ_CHAR * l_src_ptr = (OPJ_CHAR*) p_data;
					l_src_ptr += l_start_offset_src; /* Move to the first place where we will read*/

					if (l_img_comp_src->sgnd) {
						for (j = 0 ; j < l_height_dest ; ++j) {
							for ( k = 0 ; k < l_width_dest ; ++k) {
								*(l_dest_ptr++) = (OPJ_INT32) (*(l_src_ptr++)); /* Copy only the data needed for the output image */
							}

							l_dest_ptr+= l_line_offset_dest; /* Move to the next place where we will write */
							l_src_ptr += l_line_offset_src ; /* Move to the next place where we will read */
						}
					}
					else {
						for ( j = 0 ; j < l_height_dest ; ++j ) {
							for ( k = 0 ; k < l_width_dest ; ++k) {
								*(l_dest_ptr++) = (OPJ_INT32) ((*(l_src_ptr++))&0xff);
							}

							l_dest_ptr+= l_line_offset_dest;
							l_src_ptr += l_line_offset_src;
						}
					}

					l_src_ptr += l_end_offset_src; /* Move to the end of this component-part of the input buffer */
					p_data = (OPJ_BYTE*) l_src_ptr; /* Keep the current position for the next component-part */
				}
				break;
			case 2:
				{
					OPJ_INT16 * l_src_ptr = (OPJ_INT16 *) p_data;
					l_src_ptr += l_start_offset_src;

					if (l_img_comp_src->sgnd) {
						for (j=0;j<l_height_dest;++j) {
							for (k=0;k<l_width_dest;++k) {
								*(l_dest_ptr++) = *(l_src_ptr++);
							}

							l_dest_ptr+= l_line_offset_dest;
							l_src_ptr += l_line_offset_src ;
						}
					}
					else {
						for (j=0;j<l_height_dest;++j) {
							for (k=0;k<l_width_dest;++k) {
								*(l_dest_ptr++) = (*(l_src_ptr++))&0xffff;
							}

							l_dest_ptr+= l_line_offset_dest;
							l_src_ptr += l_line_offset_src ;
						}
					}

					l_src_ptr += l_end_offset_src;
					p_data = (OPJ_BYTE*) l_src_ptr;
				}
				break;
			case 4:
				{
					OPJ_INT32 * l_src_ptr = (OPJ_INT32 *) p_data;
					l_src_ptr += l_start_offset_src;

					for (j=0;j<l_height_dest;++j) {
						for (k=0;k<l_width_dest;++k) {
							*(l_dest_ptr++) = (*(l_src_ptr++));
						}

						l_dest_ptr+= l_line_offset_dest;
						l_src_ptr += l_line_offset_src ;
					}

					l_src_ptr += l_end_offset_src;
					p_data = (OPJ_BYTE*) l_src_ptr;
				}
				break;
		}

		++l_img_comp_dest;
		++l_img_comp_src;
		++l_tilec;
	}

	return OPJ_TRUE;
}